

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classviewer.cpp
# Opt level: O0

void print_Fields(ClassFile *classFile)

{
  attribute_info attributeInfo;
  FILE *pFVar1;
  ulong uVar2;
  u2 uVar3;
  ushort uVar4;
  field_info *pfVar5;
  char *pcVar6;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  ushort local_2a;
  ulong uStack_28;
  u2 j;
  field_info field;
  u2 i;
  ClassFile *classFile_local;
  
  for (field.attributes._6_2_ = 0; uVar4 = field.attributes._6_2_, pFVar1 = out,
      field.attributes._6_2_ < classFile->fields_count;
      field.attributes._6_2_ = field.attributes._6_2_ + 1) {
    pfVar5 = classFile->fields + field.attributes._6_2_;
    uStack_28._0_2_ = pfVar5->access_flags;
    uStack_28._2_2_ = pfVar5->name_index;
    uStack_28._4_2_ = pfVar5->descriptor_index;
    j = pfVar5->attributes_count;
    field._0_8_ = pfVar5->attributes;
    pcVar6 = getFormattedConstant(classFile->constant_pool,uStack_28._2_2_);
    fprintf((FILE *)pFVar1,"\t[%hu] %s\n",(ulong)uVar4,pcVar6);
    fprintf((FILE *)out,"\t{\n");
    pFVar1 = out;
    uVar3 = uStack_28._2_2_;
    pcVar6 = getFormattedConstant(classFile->constant_pool,uStack_28._2_2_);
    fprintf((FILE *)pFVar1,"\t\tName: \t\t\t cp_info #%hu <%s>\n ",(ulong)uVar3,pcVar6);
    pFVar1 = out;
    uVar3 = uStack_28._4_2_;
    pcVar6 = getFormattedConstant(classFile->constant_pool,uStack_28._4_2_);
    fprintf((FILE *)pFVar1,"\t\tDescriptor: \t cp_info #%hu <%s>\n ",(ulong)uVar3,pcVar6);
    uVar2 = uStack_28;
    pFVar1 = out;
    pcVar6 = getAccessFlags((u2)uStack_28);
    fprintf((FILE *)pFVar1,"\t\tAccess flags: \t %x [%s]\n",uVar2 & 0xffff,pcVar6);
    fprintf((FILE *)out,"\t\tAttributes:\n");
    for (local_2a = 0; local_2a < j; local_2a = local_2a + 1) {
      memcpy(&local_68,(void *)(field._0_8_ + (ulong)local_2a * 0x38),0x38);
      attributeInfo.info._0_8_ = uStack_60;
      attributeInfo.attribute_name_index = (undefined2)local_68;
      attributeInfo._2_2_ = local_68._2_2_;
      attributeInfo.attribute_length = local_68._4_4_;
      attributeInfo.info.code_info.code = (u1 *)local_58;
      attributeInfo.info._16_8_ = uStack_50;
      attributeInfo.info.code_info.exception_table = (ExceptionTable *)local_48;
      attributeInfo.info._32_8_ = uStack_40;
      attributeInfo.info.code_info.attributes = (attribute_info *)local_38;
      print_AttributeInfo(attributeInfo,(uint)local_2a,classFile->constant_pool,'\x03');
    }
    fprintf((FILE *)out,"\t}\n");
  }
  return;
}

Assistant:

void print_Fields(ClassFile *classFile) {
	for (u2 i = 0; i < classFile->fields_count; i++) {
        field_info field = classFile->fields[i];
        
		fprintf(out,"\t[%hu] %s\n", i, getFormattedConstant(classFile->constant_pool, field.name_index));
		fprintf(out, "\t{\n");
		
		fprintf(out,"\t\tName: \t\t\t cp_info #%hu <%s>\n ", field.name_index, getFormattedConstant(classFile->constant_pool, field.name_index));
		fprintf(out,"\t\tDescriptor: \t cp_info #%hu <%s>\n ", field.descriptor_index, getFormattedConstant(classFile->constant_pool, field.descriptor_index));
		fprintf(out,"\t\tAccess flags: \t %x [%s]\n", field.access_flags, getAccessFlags(field.access_flags));
        
        fprintf(out,"\t\tAttributes:\n");
        
		for (u2 j = 0; j < field.attributes_count; j++) {
            print_AttributeInfo(field.attributes[j], j, classFile->constant_pool, 3);
		}
        
		fprintf(out, "\t}\n");
	}
}